

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Effects.cpp
# Opt level: O3

void Fire(int Cooling,int Sparking,int SpeedDelay)

{
  byte *pbVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  byte bVar6;
  int i;
  long lVar7;
  int j;
  
  lVar7 = 0;
  do {
    lVar3 = random();
    iVar2 = (int)((double)lVar3 * (double)((Cooling * 10) / 0x18 + 2) * 4.656612873077393e-10);
    bVar6 = Fire::heat[lVar7] - (char)iVar2;
    if ((int)(uint)Fire::heat[lVar7] < iVar2) {
      bVar6 = '\0';
    }
    Fire::heat[lVar7] = bVar6;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x18);
  uVar4 = 0x18;
  uVar5 = (uint)Fire::heat[0x16];
  do {
    pbVar1 = (byte *)(uVar4 + 0x1061ad);
    *(char *)(uVar4 + 0x1061af) = (char)((uVar5 + (uint)*pbVar1 * 2) / 3);
    uVar4 = uVar4 - 1;
    uVar5 = (uint)*pbVar1;
  } while (2 < uVar4);
  lVar7 = random();
  if ((int)((double)lVar7 * 255.0 * 4.656612873077393e-10) < Sparking) {
    lVar7 = random();
    iVar2 = (int)((double)lVar7 * 7.0 * 4.656612873077393e-10);
    bVar6 = Fire::heat[iVar2];
    lVar7 = random();
    Fire::heat[iVar2] = (char)(int)((double)lVar7 * 95.0 * 4.656612873077393e-10) + bVar6 + 0xa0;
  }
  lVar7 = 0;
  do {
    setPixelHeatColor((int)lVar7,Fire::heat[lVar7]);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x18);
  WS2812B::Led::show(&leds);
  usleep(SpeedDelay * 1000);
  return;
}

Assistant:

void Fire(int Cooling, int Sparking, int SpeedDelay) {
    static byte heat[NUM_LEDS];
    int cooldown;

    // Step 1.  Cool down every cell a little
    for( int i = 0; i < NUM_LEDS; i++) {
        cooldown = myRandom(0, ((Cooling * 10) / NUM_LEDS) + 2);

        if(cooldown>heat[i]) {
            heat[i]=0;
        } else {
            heat[i]=heat[i]-cooldown;
        }
    }

    // Step 2.  Heat from each cell drifts 'up' and diffuses a little
    for( int k= NUM_LEDS - 1; k >= 2; k--) {
        heat[k] = (heat[k - 1] + heat[k - 2] + heat[k - 2]) / 3;
    }

    // Step 3.  Randomly ignite new 'sparks' near the bottom
    if( myRandom(0, 255) < Sparking ) {
        int y = myRandom(0, 7);
        heat[y] = heat[y] + myRandom(160,255);
        //heat[y] = random(160,255);
    }

    // Step 4.  Convert heat to LED colors
    for( int j = 0; j < NUM_LEDS; j++) {
        setPixelHeatColor(j, heat[j] );
    }

    showStrip();
    delay(SpeedDelay);
}